

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

float compute_weight_multiplier(warm_cb *data,size_t i,int ec_type)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  int in_EDX;
  size_type in_RSI;
  long in_RDI;
  float fVar4;
  float fVar5;
  float total_weight;
  float total_train_size;
  float inter_train_size;
  float ws_train_size;
  float weight_multiplier;
  undefined4 local_18;
  
  uVar1 = *(uint *)(in_RDI + 0x110);
  uVar2 = *(uint *)(in_RDI + 0x7c);
  fVar4 = (float)uVar1 + (float)uVar2;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),in_RSI);
  fVar5 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),in_RSI);
  fVar5 = (1.0 - fVar5) * (float)uVar1 + *pvVar3 * (float)uVar2;
  if (in_EDX == 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),in_RSI);
    local_18 = ((1.0 - *pvVar3) * fVar4) / (fVar5 + 1.1754944e-38);
  }
  else {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),in_RSI);
    local_18 = (*pvVar3 * fVar4) / (fVar5 + 1.1754944e-38);
  }
  return local_18;
}

Assistant:

float compute_weight_multiplier(warm_cb& data, size_t i, int ec_type)
{
	float weight_multiplier;
	float ws_train_size = data.ws_train_size;
	float inter_train_size = data.inter_period;
	float total_train_size = ws_train_size + inter_train_size;
	float total_weight = (1-data.lambdas[i]) * ws_train_size + data.lambdas[i] * inter_train_size;

	if (ec_type == WARM_START)
		weight_multiplier = (1-data.lambdas[i]) * total_train_size / (total_weight + FLT_MIN);
	else
		weight_multiplier = data.lambdas[i] * total_train_size / (total_weight + FLT_MIN);

	return weight_multiplier;
}